

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

int svd_gr2(double *A,int M,int N,double *U,double *V,double *q)

{
  long lVar1;
  size_t __size;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  void *__ptr;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  uint uVar19;
  double *pdVar20;
  ulong uVar21;
  double *pdVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  double *pdVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double __x;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double *local_138;
  ulong local_f8;
  ulong local_d8;
  int local_b8;
  void *local_a8;
  double *local_a0;
  double *local_88;
  double *local_50;
  ulong local_48;
  
  if (M < N) {
    puts("Rows (M) should be greater than Columns (B) ");
    printf("Retry By Transposing the Input Matrix");
    iVar3 = -1;
  }
  else {
    uVar7 = (ulong)N;
    __size = uVar7 * 8;
    __ptr = malloc(__size);
    dVar35 = macheps();
    if (0 < N * M) {
      uVar13 = 0;
      do {
        U[uVar13] = A[uVar13];
        uVar13 = uVar13 + 1;
      } while ((uint)(N * M) != uVar13);
    }
    if (0 < N) {
      uVar14 = (ulong)(uint)N;
      lVar8 = (long)M;
      uVar24 = (ulong)(uint)M;
      pdVar11 = U + 1;
      pdVar20 = U + uVar14;
      local_48 = 1;
      uVar16 = 0;
      dVar42 = 0.0;
      uVar13 = 0;
      pdVar22 = U;
      uVar34 = uVar14;
      dVar38 = 0.0;
      local_d8 = uVar24;
      local_88 = (double *)__ptr;
      local_50 = U;
      do {
        *(double *)((long)__ptr + uVar13 * 8) = dVar42;
        dVar42 = 0.0;
        uVar9 = local_d8;
        pdVar10 = pdVar22;
        if ((long)uVar13 < lVar8) {
          do {
            dVar42 = dVar42 + *pdVar10 * *pdVar10;
            uVar9 = uVar9 - 1;
            pdVar10 = pdVar10 + uVar14;
          } while (uVar9 != 0);
        }
        uVar9 = uVar13 + 1;
        dVar36 = 0.0;
        if (dVar35 * dVar35 <= dVar42) {
          iVar3 = (N + 1) * (int)uVar13;
          dVar41 = U[iVar3];
          if (dVar42 < 0.0) {
            dVar36 = sqrt(dVar42);
          }
          else {
            dVar36 = SQRT(dVar42);
          }
          dVar36 = (double)(~-(ulong)(dVar41 < 0.0) & (ulong)-dVar36 |
                           -(ulong)(dVar41 < 0.0) & (ulong)dVar36);
          U[iVar3] = dVar41 - dVar36;
          if ((long)uVar9 < (long)uVar7) {
            pdVar10 = pdVar11;
            uVar15 = local_48;
            do {
              dVar37 = 0.0;
              lVar25 = 0;
              uVar21 = local_d8;
              do {
                dVar37 = dVar37 + *(double *)((long)pdVar22 + lVar25) *
                                  *(double *)((long)pdVar10 + lVar25);
                lVar25 = lVar25 + uVar14 * 8;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
              lVar25 = 0;
              uVar21 = local_d8;
              do {
                *(double *)((long)pdVar10 + lVar25) =
                     *(double *)((long)pdVar22 + lVar25) * (dVar37 / (dVar41 * dVar36 - dVar42)) +
                     *(double *)((long)pdVar10 + lVar25);
                lVar25 = lVar25 + uVar14 * 8;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
              uVar15 = uVar15 + 1;
              pdVar10 = pdVar10 + 1;
            } while (uVar15 != uVar14);
          }
        }
        dVar41 = 0.0;
        q[uVar13] = dVar36;
        if ((long)uVar9 < (long)uVar7) {
          dVar41 = 0.0;
          uVar15 = 1;
          do {
            dVar41 = dVar41 + local_50[uVar16 + uVar15] * local_50[uVar16 + uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar34 != uVar15);
        }
        dVar42 = 0.0;
        if (dVar35 * dVar35 <= dVar41) {
          uVar4 = (int)uVar13 * N + (int)uVar9;
          dVar36 = U[uVar4];
          if (dVar41 < 0.0) {
            dVar42 = sqrt(dVar41);
          }
          else {
            dVar42 = SQRT(dVar41);
          }
          dVar42 = (double)(~-(ulong)(dVar36 < 0.0) & (ulong)-dVar42 |
                           -(ulong)(dVar36 < 0.0) & (ulong)dVar42);
          U[uVar4] = dVar36 - dVar42;
          if ((long)uVar9 < (long)uVar7) {
            uVar15 = 1;
            do {
              *(double *)((long)local_88 + uVar15 * 8) =
                   local_50[uVar16 + uVar15] / (dVar36 * dVar42 - dVar41);
              uVar15 = uVar15 + 1;
            } while (uVar34 != uVar15);
          }
          pdVar10 = pdVar20;
          uVar15 = local_48;
          if ((long)uVar9 < lVar8) {
            do {
              if ((long)uVar9 < (long)uVar7) {
                dVar36 = 0.0;
                uVar21 = 1;
                do {
                  dVar36 = dVar36 + pdVar10[uVar21] * local_50[uVar16 + uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar34 != uVar21);
                if ((long)uVar9 < (long)uVar7) {
                  uVar21 = 1;
                  do {
                    pdVar10[uVar21] =
                         *(double *)((long)local_88 + uVar21 * 8) * dVar36 + pdVar10[uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar34 != uVar21);
                }
              }
              uVar15 = uVar15 + 1;
              pdVar10 = pdVar10 + uVar14;
            } while (uVar15 != uVar24);
          }
        }
        dVar36 = ABS(*(double *)((long)__ptr + uVar13 * 8)) + ABS(q[uVar13]);
        if (dVar36 <= dVar38) {
          dVar36 = dVar38;
        }
        local_48 = local_48 + 1;
        pdVar22 = pdVar22 + uVar14 + 1;
        local_d8 = local_d8 - 1;
        pdVar11 = pdVar11 + uVar14 + 1;
        local_50 = local_50 + 1;
        uVar16 = (ulong)(uint)((int)uVar16 + N);
        uVar34 = uVar34 - 1;
        local_88 = (double *)((long)local_88 + 8);
        pdVar20 = pdVar20 + uVar14 + 1;
        uVar13 = uVar9;
        dVar38 = dVar36;
      } while (uVar9 != uVar14);
      if (0 < N) {
        uVar4 = N - 1;
        uVar34 = (ulong)uVar4;
        lVar25 = (uVar7 - 1) * uVar7;
        pdVar11 = U + lVar25;
        pdVar20 = V + uVar7;
        pdVar22 = V + lVar25;
        uVar13 = uVar7;
        pdVar10 = V;
        do {
          pdVar10 = pdVar10 + -1;
          pdVar20 = pdVar20 + -1;
          uVar16 = uVar13 - 1;
          if ((long)uVar13 <= (long)uVar34) {
            local_88._0_4_ = (int)uVar13;
            uVar9 = (ulong)(int)local_88;
            if (((dVar42 != 0.0) || (NAN(dVar42))) && ((int)local_88 < N)) {
              pdVar30 = (double *)((uVar7 * 8 + 8) * uVar9 + (long)V);
              pdVar17 = (double *)((long)pdVar20 + __size * uVar9);
              dVar38 = U[uVar16 * uVar7 + uVar13];
              uVar15 = (ulong)(int)local_88;
              do {
                *pdVar17 = pdVar11[uVar15] / (dVar42 * dVar38);
                uVar15 = uVar15 + 1;
                pdVar17 = pdVar17 + uVar7;
              } while (uVar7 != uVar15);
              if ((int)local_88 < N) {
                uVar15 = (long)(int)local_88;
                do {
                  dVar42 = 0.0;
                  uVar21 = (long)(int)local_88;
                  pdVar17 = pdVar30;
                  do {
                    dVar42 = dVar42 + pdVar11[uVar21] * *pdVar17;
                    uVar21 = uVar21 + 1;
                    pdVar17 = pdVar17 + uVar7;
                  } while (uVar7 != uVar21);
                  lVar28 = 0;
                  lVar25 = uVar7 - uVar9;
                  do {
                    *(double *)((long)pdVar30 + lVar28) =
                         *(double *)((long)pdVar10 + lVar28 + (uVar9 * 8 + 8) * uVar7) * dVar42 +
                         *(double *)((long)pdVar30 + lVar28);
                    lVar28 = lVar28 + __size;
                    lVar25 = lVar25 + -1;
                  } while (lVar25 != 0);
                  uVar15 = uVar15 + 1;
                  pdVar30 = pdVar30 + 1;
                } while (uVar15 != uVar7);
              }
            }
            if ((int)local_88 < N) {
              pdVar17 = (double *)(__size * uVar9 + (long)pdVar20);
              do {
                *pdVar17 = 0.0;
                pdVar22[uVar9] = 0.0;
                uVar9 = uVar9 + 1;
                pdVar17 = pdVar17 + uVar7;
              } while (uVar7 != uVar9);
            }
          }
          V[uVar16 + (long)((int)uVar16 * N)] = 1.0;
          dVar42 = *(double *)((long)__ptr + uVar16 * 8);
          pdVar11 = pdVar11 + -uVar7;
          pdVar22 = pdVar22 + -uVar7;
          bVar2 = 1 < (long)uVar13;
          uVar13 = uVar16;
        } while (bVar2);
        if (0 < N) {
          uVar12 = N * N;
          uVar5 = ~N;
          local_88 = U + uVar7 * uVar7 + -1;
          uVar6 = (N + 1) * N;
          uVar31 = uVar6 - 1;
          uVar32 = uVar12 - 1;
          uVar16 = 0;
          uVar13 = uVar7;
          local_48._0_4_ = uVar12;
          do {
            dVar42 = q[uVar13 - 1];
            if ((long)uVar13 < (long)uVar7 && (long)uVar13 <= (long)uVar34) {
              memset(U + (int)(uVar5 * (int)uVar16 + uVar12),0,
                     (uVar16 * 8 + 0x7fffffff8 & 0x7fffffff8) + 8);
            }
            uVar9 = uVar13 - 1;
            if ((dVar42 != 0.0) || (NAN(dVar42))) {
              if (uVar9 != uVar34 && (long)uVar13 < (long)uVar7) {
                uVar15 = uVar13 & 0xffffffff;
                uVar19 = (uint)local_48;
                uVar23 = uVar6;
                do {
                  dVar38 = 0.0;
                  uVar21 = uVar13 & 0xffffffff;
                  uVar27 = uVar31;
                  uVar29 = uVar23;
                  do {
                    dVar38 = dVar38 + U[uVar27] * U[uVar29];
                    uVar29 = uVar29 + N;
                    uVar27 = uVar27 + N;
                    uVar26 = (int)uVar21 + 1;
                    uVar21 = (ulong)uVar26;
                  } while ((int)uVar26 < M);
                  dVar41 = U[uVar9 * (uVar7 + 1)];
                  uVar26 = uVar4;
                  uVar27 = uVar32;
                  uVar29 = uVar19;
                  do {
                    U[uVar29] = U[uVar27] * ((dVar38 / dVar41) / dVar42) + U[uVar29];
                    uVar29 = uVar29 + N;
                    uVar27 = uVar27 + N;
                    uVar26 = uVar26 + 1;
                  } while ((int)uVar26 < M);
                  uVar27 = (int)uVar15 + 1;
                  uVar15 = (ulong)uVar27;
                  uVar23 = uVar23 + 1;
                  uVar19 = uVar19 + 1;
                } while (uVar27 != N);
              }
              uVar15 = lVar8 + 1U;
              pdVar11 = local_88;
              if ((long)uVar13 <= lVar8) {
                do {
                  *pdVar11 = *pdVar11 / dVar42;
                  uVar15 = uVar15 - 1;
                  pdVar11 = pdVar11 + uVar7;
                } while (uVar13 != uVar15);
              }
            }
            else {
              uVar15 = lVar8 + 1U;
              pdVar11 = local_88;
              if ((long)uVar13 <= lVar8) {
                do {
                  *pdVar11 = 0.0;
                  pdVar11 = pdVar11 + uVar7;
                  uVar15 = uVar15 - 1;
                } while (uVar13 != uVar15);
              }
            }
            lVar25 = (long)((int)uVar9 * N);
            U[uVar9 + lVar25] = U[uVar9 + lVar25] + 1.0;
            uVar16 = uVar16 + 1;
            local_88 = (double *)((long)local_88 + (__size ^ 0xfffffffffffffff8));
            uVar6 = uVar6 + uVar5;
            uVar31 = uVar31 + uVar5;
            local_48._0_4_ = (uint)local_48 + uVar5;
            uVar32 = uVar32 + uVar5;
            uVar4 = uVar4 - 1;
            uVar13 = uVar9;
          } while (uVar16 != uVar14);
          if (0 < N) {
            dVar35 = dVar35 * dVar36;
            local_a8 = (void *)(uVar34 * 8 + (long)__ptr);
            local_a0 = q + (uVar34 - 1);
            local_138 = V + uVar7;
            local_f8 = uVar7 - 1;
            local_b8 = N;
LAB_001400a4:
            local_138 = local_138 + -1;
            uVar13 = local_f8 - 1;
            iVar3 = 1;
            do {
              lVar8 = 0;
              iVar33 = local_b8;
              do {
                if (ABS(*(double *)((long)local_a8 + lVar8)) <= dVar35) {
                  uVar4 = iVar33 - 1;
                  goto LAB_00140233;
                }
                if (ABS(*(double *)((long)local_a0 + lVar8)) <= dVar35) break;
                iVar33 = iVar33 + -1;
                lVar8 = lVar8 + -8;
              } while (0 < iVar33);
              uVar4 = iVar33 - 1;
              lVar8 = (long)(int)uVar4;
              if (lVar8 <= (long)local_f8) {
                dVar42 = 0.0;
                lVar28 = 0;
                dVar38 = 1.0;
                lVar25 = lVar8;
                do {
                  dVar36 = *(double *)((long)__ptr + lVar25 * 8);
                  dVar38 = dVar38 * dVar36;
                  *(double *)((long)__ptr + lVar25 * 8) = dVar42 * dVar36;
                  if (ABS(dVar38) <= dVar35) break;
                  dVar42 = q[lVar25];
                  dVar36 = hypot(dVar38,dVar42);
                  q[lVar25] = dVar36;
                  dVar42 = dVar42 / dVar36;
                  dVar38 = -dVar38 / dVar36;
                  uVar34 = uVar24;
                  pdVar11 = U + lVar8;
                  do {
                    dVar36 = pdVar11[-1];
                    dVar41 = *(double *)((long)pdVar11 + lVar28);
                    pdVar11[-1] = dVar36 * dVar42 + dVar38 * dVar41;
                    *(double *)((long)pdVar11 + lVar28) = dVar41 * dVar42 - dVar38 * dVar36;
                    pdVar11 = pdVar11 + uVar7;
                    uVar34 = uVar34 - 1;
                  } while (uVar34 != 0);
                  lVar28 = lVar28 + 8;
                  bVar2 = lVar25 < (long)local_f8;
                  lVar25 = lVar25 + 1;
                } while (bVar2);
              }
LAB_00140233:
              dVar42 = q[local_f8];
              if (local_f8 == uVar4) goto LAB_00140625;
              lVar8 = (long)(int)uVar4;
              local_50 = (double *)q[lVar8];
              dVar38 = q[uVar13];
              dVar36 = *(double *)((long)__ptr + uVar13 * 8);
              dVar41 = *(double *)((long)__ptr + local_f8 * 8);
              dVar36 = ((dVar38 / dVar41 +
                        ((dVar36 - dVar42) / dVar38) * ((dVar42 + dVar36) / dVar41)) -
                       dVar41 / dVar38) * 0.5;
              dVar37 = hypot(dVar36,1.0);
              dVar42 = (dVar41 / (double)local_50) *
                       (dVar38 / ((double)((ulong)-dVar37 & -(ulong)(dVar36 < 0.0) |
                                          ~-(ulong)(dVar36 < 0.0) & (ulong)dVar37) + dVar36) -
                       dVar41) + ((double)local_50 - (dVar42 / (double)local_50) * dVar42);
              if (lVar8 < (long)local_f8) {
                pdVar11 = V + lVar8 + 1;
                lVar28 = lVar8 << 0x20;
                pdVar20 = U + lVar8 + 1;
                dVar38 = 1.0;
                lVar25 = lVar8;
                dVar36 = dVar38;
                do {
                  lVar1 = lVar25 + 1;
                  dVar41 = *(double *)((long)__ptr + lVar25 * 8 + 8);
                  dVar37 = q[lVar25 + 1];
                  dVar36 = dVar36 * dVar41;
                  dVar38 = dVar38 * dVar41;
                  dVar41 = hypot(dVar42,dVar36);
                  *(double *)((long)__ptr + lVar25 * 8) = dVar41;
                  dVar42 = dVar42 / dVar41;
                  dVar41 = dVar36 / dVar41;
                  __x = (double)local_50 * dVar42 + dVar38 * dVar41;
                  dVar40 = dVar38 * dVar42 - dVar41 * (double)local_50;
                  dVar36 = dVar37 * dVar41;
                  dVar37 = dVar37 * dVar42;
                  uVar34 = uVar14;
                  lVar18 = lVar28;
                  pdVar22 = pdVar11;
                  do {
                    dVar38 = *(double *)((long)V + (lVar18 >> 0x1d));
                    dVar39 = *pdVar22;
                    *(double *)((long)V + (lVar18 >> 0x1d)) = dVar38 * dVar42 + dVar41 * dVar39;
                    *pdVar22 = dVar39 * dVar42 - dVar41 * dVar38;
                    pdVar22 = pdVar22 + uVar7;
                    lVar18 = lVar18 + (uVar7 << 0x20);
                    uVar34 = uVar34 - 1;
                  } while (uVar34 != 0);
                  dVar39 = hypot(__x,dVar36);
                  q[lVar25] = dVar39;
                  dVar36 = dVar36 / dVar39;
                  if ((dVar39 == 0.0) && (!NAN(dVar39))) {
                    dVar36 = dVar41;
                  }
                  dVar38 = __x / dVar39;
                  if ((dVar39 == 0.0) && (!NAN(dVar39))) {
                    dVar38 = dVar42;
                  }
                  dVar42 = dVar38 * dVar40 + dVar37 * dVar36;
                  local_50 = (double *)(dVar38 * dVar37 - dVar40 * dVar36);
                  uVar34 = uVar24;
                  lVar25 = lVar28;
                  pdVar22 = pdVar20;
                  do {
                    dVar41 = *(double *)((long)U + (lVar25 >> 0x1d));
                    dVar37 = *pdVar22;
                    *(double *)((long)U + (lVar25 >> 0x1d)) = dVar41 * dVar38 + dVar36 * dVar37;
                    *pdVar22 = dVar37 * dVar38 - dVar36 * dVar41;
                    pdVar22 = pdVar22 + uVar7;
                    lVar25 = lVar25 + (uVar7 << 0x20);
                    uVar34 = uVar34 - 1;
                  } while (uVar34 != 0);
                  pdVar11 = pdVar11 + 1;
                  lVar28 = lVar28 + 0x100000000;
                  pdVar20 = pdVar20 + 1;
                  lVar25 = lVar1;
                } while (lVar1 < (long)local_f8);
              }
              *(undefined8 *)((long)__ptr + lVar8 * 8) = 0;
              *(double *)((long)__ptr + local_f8 * 8) = dVar42;
              q[local_f8] = (double)local_50;
              iVar3 = iVar3 + 1;
              if (iVar3 == 0x33) {
                puts("Convergence Not Achieved ");
                return 0xf;
              }
            } while( true );
          }
        }
      }
    }
LAB_0014069b:
    svd_sort(U,M,N,V,q);
    free(__ptr);
    iVar3 = 0;
  }
  return iVar3;
LAB_00140625:
  if (dVar42 < 0.0) {
    q[local_f8] = -dVar42;
    uVar34 = uVar14;
    pdVar11 = local_138;
    do {
      *pdVar11 = -*pdVar11;
      pdVar11 = pdVar11 + uVar7;
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
  }
  local_b8 = local_b8 + -1;
  local_a8 = (void *)((long)local_a8 + -8);
  local_a0 = local_a0 + -1;
  bVar2 = (long)local_f8 < 1;
  local_f8 = uVar13;
  if (bVar2) goto LAB_0014069b;
  goto LAB_001400a4;
}

Assistant:

int svd_gr2(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */
	if (M < N) {
		printf("Rows (M) should be greater than Columns (B) \n");
		printf("Retry By Transposing the Input Matrix");
		return -1;
	}
	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * N;
			temp = U[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = U[i*N+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			U[i*N+i] = f - g;

			for(j = l; j < N;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * N;
					s += (U[t+i]*U[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+j] += (f * U[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * N;
    	for(k = l; k < N;++k) {
    		temp = U[t+k];
    		s = s + temp*temp;
    	}
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = U[t+l];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            U[t+l] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = U[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * N;
                for (k = l; k < N; k++) {
                     s += U[t2+k] * U[t+k];
                }
                for (k = l; k < N; k++) {
                     U[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}


//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		if (i < N - 1) {
			if (g != 0.0) {
				h = U[t+i+1] * g;
				for(j = l;j < N;++j) {
					V[j*N+i] = U[t+j] / h;
				}
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < N;++k) {
						s += U[t+k] * V[k*N+j];
					}
					for(k = l; k < N;++k) {
						V[k*N+j] += (s * V[k*N+i]);
					}
				}
			}
			for(j = l; j < N;++j) {
				V[t+j] = V[j*N+i] = 0.0;
			}
		}
	    V[t+i] = 1.0;
		g = e[i];
		l = i;
	}



//Accumulating Left Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		l = i+1;
		g = q[i];

		if (i < N - 1) {
			for(j = l;j < N;++j) {
				U[t+j] = 0.0;
			}
		}

		if (g != 0.0) {
			if (i != N - 1) {
				//h = U[t+i] * g;
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < M;++k) {
						s += (U[k*N+i] * U[k*N+j]);
					}
					f = (s / U[t+i]) / g;
					for(k = i; k < M;++k) {
						U[k*N+j] += (f * U[k*N+i]);
					}
				}
			}
			for(j = i; j < M;++j) {
				U[j*N+i] = U[j*N+i] / g;
			}
		} else {
			for(j = i; j < M;++j) {
				U[j*N+i] = 0.0;
			}
		}

		U[t+i] += 1.0;
	}
//	mdisplay(U,M,N);

	eps = eps * x;

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = 0; j < M;++j) {
						t = j * N;
						y = U[t+l1];
						z = U[t+i];

						U[t+l1] = y * c + z * s;
						U[t+i] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * N;
                        x = V[t+i-1];
                        z = V[t+i];
                        V[t+i-1] = x * c + z * s;
                        V[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = 0; j < M;++j) {
                    	t = j * N;
                        y = U[t+i-1];
                        z = U[t+i];
                        U[t+i-1] = y * c + z * s;
                        U[t+i] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j *N;
                        V[t+k] = -V[t+k];
                    }
                }
                break;
			}
		}
	}

	svd_sort(U,M,N,V,q);

	free(e);
	return ierr;
}